

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O0

void Gia_CollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if ((iVar1 == 0) && (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjChild0(pObj);
      Gia_CollectSuper_rec(p,pGVar2,vSuper);
      pGVar2 = Gia_ObjChild1(pObj);
      Gia_CollectSuper_rec(p,pGVar2,vSuper);
      return;
    }
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEnable.c"
                  ,0x35,"void Gia_CollectSuper_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  pGVar2 = Gia_Regular(pObj);
  iVar1 = Gia_ObjId(p,pGVar2);
  Vec_IntPushUnique(vSuper,iVar1);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects the supergate.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_CollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_Regular(pObj)) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    // go through the branches
    Gia_CollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper );
    Gia_CollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper );
}